

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,true,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  int64_t *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  sel_t sVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  unsigned_long uVar15;
  long lVar16;
  bool bVar17;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    iVar13 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar13 = 0;
    lVar9 = 0;
    uVar7 = 0;
    uVar14 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar2[uVar7];
      }
      uVar11 = uVar14 + 0x40;
      if (count <= uVar14 + 0x40) {
        uVar11 = count;
      }
      uVar12 = uVar14;
      if (uVar15 == 0xffffffffffffffff) {
        if (uVar14 < uVar11) {
          psVar3 = sel->sel_vector;
          iVar1 = ldata->months;
          psVar4 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          piVar6 = &rdata[uVar14].micros;
          do {
            uVar12 = uVar14;
            if (psVar3 != (sel_t *)0x0) {
              uVar12 = (ulong)psVar3[uVar14];
            }
            if (((iVar1 != ((interval_t *)(piVar6 + -1))->months) ||
                (ldata->days != *(int32_t *)((long)piVar6 + -4))) ||
               (bVar17 = true, ldata->micros != *piVar6)) {
              lVar16 = (long)ldata->days + ldata->micros / 86400000000;
              lVar8 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
              bVar17 = false;
              if ((lVar16 / 0x1e + (long)iVar1 ==
                   (long)((interval_t *)(piVar6 + -1))->months + lVar8 / 0x1e) &&
                 (bVar17 = false, lVar16 % 0x1e == lVar8 % 0x1e)) {
                bVar17 = ldata->micros % 86400000000 == *piVar6 % 86400000000;
              }
            }
            psVar4[iVar13] = (sel_t)uVar12;
            iVar13 = iVar13 + bVar17;
            psVar5[lVar9] = (sel_t)uVar12;
            lVar9 = lVar9 + (ulong)(bVar17 ^ 1);
            uVar14 = uVar14 + 1;
            piVar6 = piVar6 + 2;
            uVar12 = uVar14;
          } while (uVar11 != uVar14);
        }
      }
      else if (uVar15 == 0) {
        uVar12 = uVar11;
        if (uVar14 < uVar11) {
          psVar3 = sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          do {
            sVar10 = (sel_t)uVar14;
            if (psVar3 != (sel_t *)0x0) {
              sVar10 = psVar3[uVar14];
            }
            psVar4[lVar9] = sVar10;
            lVar9 = lVar9 + 1;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
      }
      else if (uVar14 < uVar11) {
        psVar3 = sel->sel_vector;
        psVar4 = true_sel->sel_vector;
        psVar5 = false_sel->sel_vector;
        piVar6 = &rdata[uVar14].micros;
        uVar12 = 0;
        do {
          if (psVar3 == (sel_t *)0x0) {
            sVar10 = (int)uVar14 + (int)uVar12;
          }
          else {
            sVar10 = psVar3[uVar14 + uVar12];
          }
          if ((uVar15 >> (uVar12 & 0x3f) & 1) == 0) {
            bVar17 = false;
          }
          else if (((ldata->months != ((interval_t *)(piVar6 + -1))->months) ||
                   (ldata->days != *(int32_t *)((long)piVar6 + -4))) ||
                  (bVar17 = true, ldata->micros != *piVar6)) {
            lVar16 = (long)ldata->days + ldata->micros / 86400000000;
            lVar8 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
            bVar17 = false;
            if (((long)ldata->months + lVar16 / 0x1e ==
                 (long)((interval_t *)(piVar6 + -1))->months + lVar8 / 0x1e) &&
               (bVar17 = false, lVar16 % 0x1e == lVar8 % 0x1e)) {
              bVar17 = ldata->micros % 86400000000 == *piVar6 % 86400000000;
            }
          }
          psVar4[iVar13] = sVar10;
          iVar13 = iVar13 + bVar17;
          psVar5[lVar9] = sVar10;
          lVar9 = (ulong)(bVar17 ^ 1) + lVar9;
          uVar12 = uVar12 + 1;
          piVar6 = piVar6 + 2;
        } while ((uVar14 - uVar11) + uVar12 != 0);
        uVar12 = uVar14 + uVar12;
      }
      uVar7 = uVar7 + 1;
      uVar14 = uVar12;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return iVar13;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}